

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_mask_util.cc
# Opt level: O0

bool __thiscall
google::protobuf::util::FieldMaskUtil::IsPathInFieldMask
          (FieldMaskUtil *this,string_view path,FieldMask *mask)

{
  basic_string_view<char,_std::char_traits<char>_> __x;
  bool bVar1;
  int iVar2;
  string *this_00;
  char *pcVar3;
  char *pcVar4;
  basic_string_view<char,_std::char_traits<char>_> __y;
  string_view expected;
  string_view expected_00;
  basic_string_view<char,_std::char_traits<char>_> local_90;
  Nonnull<absl::string_view_*> local_80;
  size_t local_78;
  basic_string_view<char,_std::char_traits<char>_> local_70;
  char *local_60;
  char *local_58;
  undefined1 local_50 [8];
  string_view mask_path;
  string_view current;
  int i;
  FieldMask *mask_local;
  string_view path_local;
  
  current._M_str._4_4_ = 0;
  while( true ) {
    iVar2 = FieldMask::paths_size((FieldMask *)path._M_str);
    if (iVar2 <= current._M_str._4_4_) {
      return false;
    }
    mask_path._M_str = (char *)this;
    this_00 = FieldMask::paths_abi_cxx11_((FieldMask *)path._M_str,current._M_str._4_4_);
    __y = (basic_string_view<char,_std::char_traits<char>_>)
          std::__cxx11::string::operator_cast_to_basic_string_view((string *)this_00);
    mask_path._M_len = (size_t)__y._M_str;
    local_50 = (undefined1  [8])__y._M_len;
    local_60 = mask_path._M_str;
    __x._M_str = (char *)path._M_len;
    __x._M_len = (size_t)mask_path._M_str;
    local_58 = (char *)path._M_len;
    local_70 = __y;
    bVar1 = std::operator==(__x,__y);
    if (bVar1) break;
    pcVar3 = (char *)std::basic_string_view<char,_std::char_traits<char>_>::length
                               ((basic_string_view<char,_std::char_traits<char>_> *)local_50);
    pcVar4 = (char *)std::basic_string_view<char,_std::char_traits<char>_>::length
                               ((basic_string_view<char,_std::char_traits<char>_> *)
                                &mask_path._M_str);
    if (pcVar3 < pcVar4) {
      local_80 = (Nonnull<absl::string_view_*>)local_50;
      local_78 = mask_path._M_len;
      expected._M_str = pcVar4;
      expected._M_len = mask_path._M_len;
      bVar1 = absl::lts_20240722::ConsumePrefix
                        ((lts_20240722 *)&mask_path._M_str,(Nonnull<absl::string_view_*>)local_50,
                         expected);
      if (bVar1) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_90,".");
        expected_00._M_str = pcVar4;
        expected_00._M_len = (size_t)local_90._M_str;
        bVar1 = absl::lts_20240722::ConsumePrefix
                          ((lts_20240722 *)&mask_path._M_str,
                           (Nonnull<absl::string_view_*>)local_90._M_len,expected_00);
        if (bVar1) {
          return true;
        }
      }
    }
    current._M_str._4_4_ = current._M_str._4_4_ + 1;
  }
  return true;
}

Assistant:

bool FieldMaskUtil::IsPathInFieldMask(absl::string_view path,
                                      const FieldMask& mask) {
  for (int i = 0; i < mask.paths_size(); ++i) {
    absl::string_view current = path;
    absl::string_view mask_path = mask.paths(i);
    if (current == mask_path) {
      return true;
    }
      // Also check whether mask.paths(i) is a prefix of path.
    if (mask_path.length() < current.length() &&
        absl::ConsumePrefix(&current, mask_path) &&
        absl::ConsumePrefix(&current, ".")) {
      return true;
    }
  }
  return false;
}